

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNStmProg::fold_constants(CTPNStmProg *this,CTcPrsSymtab *symtab)

{
  CTPNStmTop *pCVar1;
  CTPNStmTop **ppCVar2;
  
  ppCVar2 = &this->first_stm_;
  while (pCVar1 = *ppCVar2, pCVar1 != (CTPNStmTop *)0x0) {
    (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0xf])(pCVar1,symtab);
    ppCVar2 = &pCVar1->next_stm_top_;
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNStmProg::fold_constants(class CTcPrsSymtab *symtab)
{
    CTPNStmTop *cur;

    /* iterate through our statements and fold constants in each one */
    for (cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm_top())
        cur->fold_constants(symtab);

    /* 
     *   although nodes within our subtree might have been changed, this
     *   compound statement itself is unchanged by constant folding 
     */
    return this;
}